

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryUint::test
          (ShaderBitfieldOperationCaseBinaryUint *this,Data *data)

{
  int iVar1;
  GLuint GVar2;
  int i;
  long lVar3;
  GLuint expected2;
  GLuint local_2c;
  
  for (lVar3 = 0; iVar1 = this->m_components, lVar3 < iVar1; lVar3 = lVar3 + 1) {
    local_2c = 0;
    GVar2 = (*this->m_func)(data->inUvec4[lVar3],data->in2Uvec4[lVar3],&local_2c);
    if ((data->outUvec4[lVar3] != GVar2) || (data->out2Uvec4[lVar3] != local_2c)) break;
  }
  return iVar1 <= lVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected2 = 0;
			GLuint expected  = m_func(data->inUvec4[i], data->in2Uvec4[i], expected2);
			if (data->outUvec4[i] != expected || data->out2Uvec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}